

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O2

SingleAttribute<avro::Name> *
avro::asSingleAttribute<avro::Name>(SingleAttribute<avro::Name> *__return_storage_ptr__,Name *t)

{
  (__return_storage_ptr__->attr_).ns_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->attr_).ns_.field_2;
  (__return_storage_ptr__->attr_).ns_._M_string_length = 0;
  (__return_storage_ptr__->attr_).ns_.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->attr_).simpleName_._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->attr_).simpleName_.field_2;
  (__return_storage_ptr__->attr_).simpleName_._M_string_length = 0;
  (__return_storage_ptr__->attr_).simpleName_.field_2._M_local_buf[0] = '\0';
  Name::operator=(&__return_storage_ptr__->attr_,t);
  return __return_storage_ptr__;
}

Assistant:

concepts::SingleAttribute<T> asSingleAttribute(const T& t)
{
    concepts::SingleAttribute<T> n;
    n.add(t);
    return n;
}